

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O1

void static_task(uint W)

{
  U *pUVar1;
  int *piVar2;
  handle_t *__v;
  code *pcVar3;
  long *plVar4;
  _Head_base<0UL,_tf::Node_*,_false> _Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  char extraout_AL;
  bool bVar8;
  char extraout_AL_00;
  char extraout_AL_01;
  char extraout_AL_02;
  char extraout_AL_03;
  int iVar9;
  long lVar10;
  Static *__storage;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  double dVar12;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 uVar13;
  ResultBuilder DOCTEST_RB;
  Task C;
  atomic<unsigned_long> counter;
  Task E;
  Task D;
  Task B;
  Task F;
  Task A;
  Taskflow taskflow;
  Executor executor;
  ResultBuilder local_350;
  Result local_2d8;
  anon_class_1_0_00000001 local_2b3;
  anon_class_1_0_00000001 local_2b2;
  anon_class_1_0_00000001 local_2b1;
  _Head_base<0UL,_tf::Node_*,_false> local_2b0;
  undefined8 local_2a8 [2];
  _Head_base<0UL,_tf::Node_*,_false> local_298;
  _Head_base<0UL,_tf::Node_*,_false> local_290;
  _Head_base<0UL,_tf::Node_*,_false> local_288;
  anon_class_8_1_69701ed9 local_280;
  undefined8 *local_278;
  undefined4 local_270;
  _Head_base<0UL,_tf::Node_*,_false> local_268;
  _Head_base<0UL,_tf::Node_*,_false> local_260;
  shared_ptr<tf::WorkerInterface> local_258;
  anon_class_8_1_69701ed9 local_240;
  anon_class_8_1_69701ed9 local_238;
  undefined1 local_230 [80];
  pointer local_1e0;
  pointer puStack_1d8;
  pointer local_1d0;
  _Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
  _Stack_1c8;
  bool local_170;
  Executor local_168;
  
  local_230._0_8_ = &local_1e0;
  local_230._8_8_ = 0;
  local_230._16_8_ = 0;
  local_230._24_8_ = 0;
  local_230._32_8_ = (__pthread_internal_list *)0x0;
  local_230._40_8_ = (__pthread_internal_list *)0x0;
  local_230._48_8_ = local_230 + 0x40;
  local_230._56_8_ = 0;
  local_230[0x40] = '\0';
  local_1e0 = (pointer)0x0;
  puStack_1d8 = (pointer)0x0;
  local_1d0 = (pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_1c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
  _M_initialize_map(&_Stack_1c8,0);
  local_170 = false;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,(ulong)W,&local_258);
  if (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  uVar6 = local_230._0_8_;
  local_2a8[0] = 0;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:17:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:17:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar6,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  uVar7 = local_230._0_8_;
  local_260._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar6)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:18:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:18:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar7,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  uVar6 = local_230._0_8_;
  local_288._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar7)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:19:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:19:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar6,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  uVar7 = local_230._0_8_;
  local_2b0._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar6)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:20:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:20:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar7,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  uVar6 = local_230._0_8_;
  local_290._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar7)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:21:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:21:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar6,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  uVar7 = local_230._0_8_;
  local_298._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar6)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_350.super_AssertData.m_test_case = (TestCaseData *)operator_new(0xd8);
  ((Node *)local_350.super_AssertData.m_test_case)->_nstate = 0;
  ((Node *)local_350.super_AssertData.m_test_case)->_estate = (__atomic_base<int>)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_dataplus._M_p =
       (pointer)&(((Node *)local_350.super_AssertData.m_test_case)->_name).field_2;
  (((Node *)local_350.super_AssertData.m_test_case)->_name)._M_string_length = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_name).field_2._M_local_buf[0] = '\0';
  pUVar1 = &(((Node *)local_350.super_AssertData.m_test_case)->_edges).
            super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
            super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
  ((Node *)local_350.super_AssertData.m_test_case)->_data = (void *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_topology = (Topology *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_parent = (Node *)0x0;
  ((Node *)local_350.super_AssertData.m_test_case)->_num_successors = 0;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.BeginX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.EndX = pUVar1;
  (((Node *)local_350.super_AssertData.m_test_case)->_edges).super_SmallVectorImpl<tf::Node_*>.
  super_SmallVectorTemplateBase<tf::Node_*,_true>.super_SmallVectorTemplateCommon<tf::Node_*,_void>.
  super_SmallVectorBase.CapacityX = &((Node *)local_350.super_AssertData.m_test_case)->_join_counter
  ;
  (((Node *)local_350.super_AssertData.m_test_case)->_join_counter).
  super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(undefined8 **)
   &(((Node *)local_350.super_AssertData.m_test_case)->_handle).
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = local_2a8;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:22:29)>
       ::_M_invoke;
  *(code **)((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:22:29)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(((Node *)local_350.super_AssertData.m_test_case)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  (((Node *)local_350.super_AssertData.m_test_case)->_semaphores)._M_t.
  super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
  super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
  super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
  (((Node *)local_350.super_AssertData.m_test_case)->_exception_ptr)._M_exception_object =
       (void *)0x0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)uVar7,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_350);
  if ((Node *)local_350.super_AssertData.m_test_case != (Node *)0x0) {
    std::default_delete<tf::Node>::operator()
              ((default_delete<tf::Node> *)&local_350,(Node *)local_350.super_AssertData.m_test_case
              );
  }
  local_268._M_head_impl =
       (((vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
          *)uVar7)->
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Task::precede<tf::Task&>((Task *)&local_260,(Task *)&local_288);
  tf::Task::precede<tf::Task&>((Task *)&local_288,(Task *)&local_2b0);
  tf::Task::precede<tf::Task&>((Task *)&local_2b0,(Task *)&local_290);
  tf::Task::precede<tf::Task&>((Task *)&local_290,(Task *)&local_298);
  tf::Task::precede<tf::Task&>((Task *)&local_298,(Task *)&local_268);
  local_350.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_350.super_AssertData.m_at = DT_REQUIRE_NOTHROW;
  local_350.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  local_350.super_AssertData.m_line = 0x1e;
  local_350.super_AssertData.m_expr = "executor.run(taskflow).get()";
  local_350.super_AssertData.m_failed = true;
  local_350.super_AssertData.m_threw = false;
  local_350.super_AssertData.m_threw_as = false;
  local_350.super_AssertData.m_exception_type = "";
  local_350.super_AssertData.m_exception_string = "";
  local_240.repeat = 1;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&local_2d8,&local_168,(Taskflow *)local_230,&local_240,&local_2b3);
  std::future<void>::get((future<void> *)&local_2d8);
  plVar4 = (long *)CONCAT17(local_2d8.m_decomp.field_0.buf[0x17],local_2d8.m_decomp.field_0._16_7_);
  dVar12 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  if (plVar4 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = (int *)((long)plVar4 + 0xc);
      iVar9 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    else {
      iVar9 = *(int *)((long)plVar4 + 0xc);
      *(int *)((long)plVar4 + 0xc) = iVar9 + -1;
    }
    dVar12 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if (iVar9 == 1) {
      dVar12 = (double)(**(code **)(*plVar4 + 0x18))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr);
    dVar12 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  dVar12 = doctest::detail::ResultBuilder::log(&local_350,dVar12);
  if (extraout_AL != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar12,0));
    return;
  }
  if (local_350.super_AssertData.m_failed == true) {
    bVar8 = doctest::detail::checkIfShouldThrow(local_350.super_AssertData.m_at);
    if (bVar8) {
      doctest::detail::throwException();
    }
  }
  if ((local_350.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                       local_350.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                                       local_350.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_350.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                       local_350.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                                       local_350.super_AssertData.m_exception.field_0.buf[0]));
  }
  local_350.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_350.super_AssertData.m_at = DT_REQUIRE;
  local_350.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  local_350.super_AssertData.m_line = 0x1f;
  local_350.super_AssertData.m_expr = "counter == 6";
  local_350.super_AssertData.m_failed = true;
  local_350.super_AssertData.m_threw = false;
  local_350.super_AssertData.m_threw_as = false;
  local_350.super_AssertData.m_exception_type = "";
  local_350.super_AssertData.m_exception_string = "";
  local_270 = 0xc;
  local_280.repeat._0_4_ = 6;
  local_278 = local_2a8;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (&local_2d8,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_278,
             (int *)&local_280);
  doctest::String::operator=(&local_350.super_AssertData.m_decomp,&local_2d8.m_decomp);
  local_350.super_AssertData._40_2_ =
       CONCAT11(local_350.super_AssertData.m_threw,local_2d8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_01;
  uVar13 = extraout_XMM0_Db_01;
  if ((local_2d8.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_2d8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_02;
    uVar13 = extraout_XMM0_Db_02;
  }
  doctest::detail::ResultBuilder::log(&local_350,(double)CONCAT44(uVar13,uVar11));
  if (extraout_AL_00 != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)();
    return;
  }
  if (local_350.super_AssertData.m_failed == true) {
    bVar8 = doctest::detail::checkIfShouldThrow(local_350.super_AssertData.m_at);
    if (bVar8) {
      doctest::detail::throwException();
    }
  }
  if ((local_350.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                       local_350.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                                       local_350.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_350.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                       local_350.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                                       local_350.super_AssertData.m_exception.field_0.buf[0]));
  }
  _Var5._M_head_impl = local_2b0._M_head_impl;
  LOCK();
  local_2a8[0] = 0;
  UNLOCK();
  __v = &(local_2b0._M_head_impl)->_handle;
  lVar10 = (long)(char)*(__index_type *)
                        ((long)&((local_2b0._M_head_impl)->_handle).
                                super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                                .
                                super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                                .
                                super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                                .
                                super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                                .
                                super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                                .
                                super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        + 0x38);
  if (lVar10 != -1) {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>_&>
      ::_S_vtable._M_arr[lVar10]._M_data)((anon_class_1_0_00000001 *)&local_350,__v);
    *(__index_type *)
     ((long)&((_Var5._M_head_impl)->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = 0xff;
  }
  *(undefined8 *)
   &(__v->
    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ).
    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    .
    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&((_Var5._M_head_impl)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 8) = 0;
  *(undefined8 *)
   ((long)&((_Var5._M_head_impl)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x10) = 0;
  *(code **)((long)&((_Var5._M_head_impl)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x18) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:34:10)>
       ::_M_invoke;
  *(code **)((long)&((_Var5._M_head_impl)->_handle).
                    super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                    .
                    super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
            + 0x10) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp:34:10)>
       ::_M_manager;
  *(__index_type *)
   ((long)&((_Var5._M_head_impl)->_handle).
           super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
           .
           super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
   + 0x38) = '\x01';
  std::
  get<1ul,std::monostate,tf::Node::Static,tf::Node::Runtime,tf::Node::Subflow,tf::Node::Condition,tf::Node::MultiCondition,tf::Node::Module,tf::Node::Async,tf::Node::DependentAsync>
            (__v);
  if (*(char *)(doctest::detail::g_cs + 0x72) == '\0') {
    local_350.super_AssertData.m_exception.field_0.buf[0] = '\0';
    local_350.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
    local_350.super_AssertData.m_decomp.field_0.buf[0] = '\0';
    local_350.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    local_350.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_350.super_AssertData.m_at = DT_REQUIRE_THROWS_WITH_AS;
    local_350.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
    ;
    local_350.super_AssertData.m_line = 0x24;
    local_350.super_AssertData.m_expr = "executor.run(taskflow).get()";
    local_350.super_AssertData.m_failed = true;
    local_350.super_AssertData.m_threw = false;
    local_350.super_AssertData.m_threw_as = false;
    local_350.super_AssertData.m_exception_type = "std::runtime_error";
    local_350.super_AssertData.m_exception_string = "x";
    local_238.repeat = 1;
    tf::Executor::
    run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
              ((Future<void> *)&local_2d8,&local_168,(Taskflow *)local_230,&local_238,&local_2b2);
    std::future<void>::get((future<void> *)&local_2d8);
    plVar4 = (long *)CONCAT17(local_2d8.m_decomp.field_0.buf[0x17],local_2d8.m_decomp.field_0._16_7_
                             );
    dVar12 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    if (plVar4 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar2 = (int *)((long)plVar4 + 0xc);
        iVar9 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
      }
      else {
        iVar9 = *(int *)((long)plVar4 + 0xc);
        *(int *)((long)plVar4 + 0xc) = iVar9 + -1;
      }
      dVar12 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
      if (iVar9 == 1) {
        dVar12 = (double)(**(code **)(*plVar4 + 0x18))();
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr
                );
      dVar12 = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
    dVar12 = doctest::detail::ResultBuilder::log(&local_350,dVar12);
    if (extraout_AL_01 != '\0') {
      pcVar3 = (code *)swi(3);
      (*pcVar3)(SUB84(dVar12,0));
      return;
    }
    if (local_350.super_AssertData.m_failed == true) {
      bVar8 = doctest::detail::checkIfShouldThrow(local_350.super_AssertData.m_at);
      if (bVar8) {
        doctest::detail::throwException();
      }
    }
    if ((local_350.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                         local_350.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                                         local_350.super_AssertData.m_decomp.field_0.buf[0]));
    }
    if ((local_350.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
       ((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                         local_350.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                                         local_350.super_AssertData.m_exception.field_0.buf[0]));
    }
  }
  local_350.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_350.super_AssertData.m_at = DT_REQUIRE;
  local_350.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  local_350.super_AssertData.m_line = 0x25;
  local_350.super_AssertData.m_expr = "counter == 2";
  local_350.super_AssertData.m_failed = true;
  local_350.super_AssertData.m_threw = false;
  local_350.super_AssertData.m_threw_as = false;
  local_350.super_AssertData.m_exception_type = "";
  local_350.super_AssertData.m_exception_string = "";
  local_270 = 0xc;
  local_280.repeat._0_4_ = 2;
  local_278 = local_2a8;
  doctest::detail::Expression_lhs<std::atomic<unsigned_long>const&>::operator==
            (&local_2d8,(Expression_lhs<std::atomic<unsigned_long>const&> *)&local_278,
             (int *)&local_280);
  doctest::String::operator=(&local_350.super_AssertData.m_decomp,&local_2d8.m_decomp);
  local_350.super_AssertData._40_2_ =
       CONCAT11(local_350.super_AssertData.m_threw,local_2d8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_05;
  uVar13 = extraout_XMM0_Db_05;
  if ((local_2d8.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_2d8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_06;
    uVar13 = extraout_XMM0_Db_06;
  }
  dVar12 = doctest::detail::ResultBuilder::log(&local_350,(double)CONCAT44(uVar13,uVar11));
  if (extraout_AL_02 != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar12,0));
    return;
  }
  if (local_350.super_AssertData.m_failed == true) {
    bVar8 = doctest::detail::checkIfShouldThrow(local_350.super_AssertData.m_at);
    if (bVar8) {
      doctest::detail::throwException();
    }
  }
  if ((local_350.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                       local_350.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                                       local_350.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_350.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                       local_350.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                                       local_350.super_AssertData.m_exception.field_0.buf[0]));
  }
  LOCK();
  local_2a8[0] = 0;
  UNLOCK();
  local_280.repeat = 1;
  tf::Executor::
  run_until<tf::Executor::run_n<tf::Executor::run(tf::Taskflow&)::_lambda()_1_>(tf::Taskflow&,unsigned_long,tf::Executor::run(tf::Taskflow&)::_lambda()_1_&&)::_lambda()_1_,tf::Executor::run(tf::Taskflow&)::_lambda()_1_>
            ((Future<void> *)&local_350,&local_168,(Taskflow *)local_230,&local_280,&local_2b1);
  std::future<void>::get((future<void> *)&local_350);
  plVar4 = (long *)CONCAT44(local_350.super_AssertData._28_4_,local_350.super_AssertData.m_line);
  if (plVar4 != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar2 = (int *)((long)plVar4 + 0xc);
      iVar9 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
    }
    else {
      iVar9 = *(int *)((long)plVar4 + 0xc);
      *(int *)((long)plVar4 + 0xc) = iVar9 + -1;
    }
    if (iVar9 == 1) {
      (**(code **)(*plVar4 + 0x18))();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_350.super_AssertData._12_4_,local_350.super_AssertData.m_at) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_350.super_AssertData._12_4_,local_350.super_AssertData.m_at));
  }
  local_350.super_AssertData.m_exception.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_exception.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_decomp.field_0.buf[0] = '\0';
  local_350.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
  local_350.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
  local_350.super_AssertData.m_at = DT_REQUIRE;
  local_350.super_AssertData.m_file =
       "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_exceptions.cpp"
  ;
  local_350.super_AssertData.m_line = 0x2a;
  local_350.super_AssertData.m_expr = "false";
  local_350.super_AssertData.m_failed = true;
  local_350.super_AssertData.m_threw = false;
  local_350.super_AssertData.m_threw_as = false;
  local_350.super_AssertData.m_exception_type = "";
  local_350.super_AssertData.m_exception_string = "";
  local_278 = (undefined8 *)0xc00000000;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_2d8,(Expression_lhs *)&local_278);
  doctest::String::operator=(&local_350.super_AssertData.m_decomp,&local_2d8.m_decomp);
  local_350.super_AssertData._40_2_ =
       CONCAT11(local_350.super_AssertData.m_threw,local_2d8.m_passed) ^ 1;
  uVar11 = extraout_XMM0_Da_07;
  uVar13 = extraout_XMM0_Db_07;
  if ((local_2d8.m_decomp.field_0.buf[0x17] < '\0') &&
     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8.m_decomp.field_0.data.ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    operator_delete__(local_2d8.m_decomp.field_0.data.ptr);
    uVar11 = extraout_XMM0_Da_08;
    uVar13 = extraout_XMM0_Db_08;
  }
  dVar12 = doctest::detail::ResultBuilder::log(&local_350,(double)CONCAT44(uVar13,uVar11));
  if (extraout_AL_03 != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar12,0));
    return;
  }
  if (local_350.super_AssertData.m_failed == true) {
    bVar8 = doctest::detail::checkIfShouldThrow(local_350.super_AssertData.m_at);
    if (bVar8) {
      doctest::detail::throwException();
    }
  }
  if ((local_350.super_AssertData.m_decomp.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                       local_350.super_AssertData.m_decomp.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_decomp.field_0._1_7_,
                                       local_350.super_AssertData.m_decomp.field_0.buf[0]));
  }
  if ((local_350.super_AssertData.m_exception.field_0.buf[0x17] < '\0') &&
     ((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                       local_350.super_AssertData.m_exception.field_0.buf[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_350.super_AssertData.m_exception.field_0._1_7_,
                                       local_350.super_AssertData.m_exception.field_0.buf[0]));
  }
  tf::Executor::~Executor(&local_168);
  tf::Taskflow::~Taskflow((Taskflow *)local_230);
  return;
}

Assistant:

void static_task(unsigned W) {

  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter(0);

  auto A = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto B = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto C = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto D = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto E = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });
  auto F = taskflow.emplace([&](){ counter.fetch_add(1, std::memory_order_relaxed); });

  A.precede(B);
  B.precede(C);
  C.precede(D);
  D.precede(E);
  E.precede(F);

  REQUIRE_NOTHROW(executor.run(taskflow).get());
  REQUIRE(counter == 6);

  counter = 0;
  C.work([](){ throw std::runtime_error("x"); });
  
  REQUIRE_THROWS_WITH_AS(executor.run(taskflow).get(), "x", std::runtime_error);
  REQUIRE(counter == 2);

  try {
    counter = 0;
    executor.run(taskflow).get();
    REQUIRE(false);
  }
  catch(std::runtime_error& e) {
    REQUIRE(counter == 2);
    REQUIRE(std::strcmp(e.what(), "x") == 0);
  }
}